

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O2

void Vec_IntSelectSortCost(int *pArray,int nSize,Vec_Int_t *vCosts)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  iVar1 = 1;
  if (1 < nSize) {
    iVar1 = nSize;
  }
  uVar7 = 1;
  for (uVar5 = 0; uVar5 != iVar1 - 1; uVar5 = uVar5 + 1) {
    uVar9 = uVar5 & 0xffffffff;
    uVar6 = uVar7;
    while( true ) {
      uVar8 = (uint)uVar9;
      if ((uint)nSize == uVar6) break;
      iVar2 = Vec_IntEntry(vCosts,pArray[uVar6]);
      iVar3 = Vec_IntEntry(vCosts,pArray[(int)uVar8]);
      uVar4 = (uint)uVar6;
      if (iVar3 <= iVar2) {
        uVar4 = uVar8;
      }
      uVar6 = uVar6 + 1;
      uVar9 = (ulong)uVar4;
    }
    iVar2 = pArray[uVar5];
    pArray[uVar5] = pArray[(int)uVar8];
    pArray[(int)uVar8] = iVar2;
    uVar7 = uVar7 + 1;
  }
  return;
}

Assistant:

static inline void Vec_IntSelectSortCost( int * pArray, int nSize, Vec_Int_t * vCosts )
{
    int i, j, best_i;
    for ( i = 0; i < nSize-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < nSize; j++ )
            if ( Vec_IntEntry(vCosts, pArray[j]) < Vec_IntEntry(vCosts, pArray[best_i]) )
                best_i = j;
        ABC_SWAP( int, pArray[i], pArray[best_i] );
    }
}